

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week7-app3.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  allocator<int> *this_01;
  mapped_type mVar1;
  initializer_list<Gender> __l;
  initializer_list<int> __l_00;
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  bool bVar2;
  mapped_type *pmVar3;
  ostream *this_02;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_350;
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_330;
  allocator<Gender> local_2dd;
  Gender local_2dc [3];
  iterator local_2d0;
  size_type local_2c8;
  undefined1 local_2c0 [8];
  vector<Gender,_std::allocator<Gender>_> vg;
  array<float,_3UL> a;
  int local_294 [3];
  iterator local_288;
  size_type local_280;
  undefined1 local_278 [8];
  vector<int,_std::allocator<int>_> v;
  key_type local_258;
  type *local_238;
  type *value;
  type *key;
  _Self local_220;
  iterator __end1;
  iterator __begin1;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  m2;
  int local_1d0 [2];
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  iterator local_148;
  _Alloc_hider local_140;
  undefined1 local_138 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m1;
  undefined1 local_f8 [40];
  undefined4 local_d0;
  string local_c8 [32];
  undefined4 local_a8;
  string local_a0 [32];
  iterator local_80;
  _Alloc_hider local_78;
  undefined1 local_70 [8];
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vp;
  allocator<char> local_41;
  undefined1 local_40 [8];
  KeyValue p;
  char **argv_local;
  int argc_local;
  
  local_40._0_4_ = 10;
  p.second.field_2._8_8_ = argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&p,"ten",&local_41);
  std::allocator<char>::~allocator(&local_41);
  m1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = 1;
  local_f8._0_4_ = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_f8 + 8),"ten",
             (allocator<char> *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_d0 = 0xb;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"eleven",
             (allocator<char> *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  local_a8 = 0xc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"twelve",
             (allocator<char> *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
  m1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = 0;
  local_80 = (iterator)local_f8;
  local_78._M_p = (pointer)0x3;
  this = (allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 3);
  std::
  allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(this);
  __l_02._M_len = (size_type)local_78._M_p;
  __l_02._M_array = local_80;
  std::
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_70,__l_02,this);
  std::
  allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  local_330 = (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_80;
  do {
    local_330 = local_330 + -1;
    Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~Pair(local_330);
  } while (local_330 !=
           (Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 5));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 6));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&m1._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_1c8 = &local_1c0;
  local_1d0[1] = 10;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[4],_true>(local_1c8,local_1d0 + 1,(char (*) [4])"ten");
  local_1c8 = &local_198;
  local_1d0[0] = 0xb;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>(local_1c8,local_1d0,(char (*) [7])"eleven");
  local_1c8 = &local_170;
  m2._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xc;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>
            (local_1c8,(int *)((long)&m2._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
             (char (*) [7])"twelve");
  local_148 = &local_1c0;
  local_140._M_p = (pointer)0x3;
  this_00 = (allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&m2._M_t._M_impl.super__Rb_tree_header._M_node_count + 2);
  std::
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(this_00);
  __l_01._M_len = (size_type)local_140._M_p;
  __l_01._M_array = local_148;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_138,__l_01,
        (less<int> *)((long)&m2._M_t._M_impl.super__Rb_tree_header._M_node_count + 3),this_00);
  std::
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&m2._M_t._M_impl.super__Rb_tree_header._M_node_count + 2));
  local_350 = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_148;
  do {
    local_350 = local_350 + -1;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_350);
  } while (local_350 != &local_1c0);
  memset(&__range1,0,0x30);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&__range1);
  __end1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_138);
  local_220._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_138);
  while( true ) {
    bVar2 = std::operator==(&__end1,&local_220);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    key = &std::
           _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator*(&__end1)->first;
    value = (type *)std::get<0ul,int_const,std::__cxx11::string>
                              ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)key);
    local_238 = std::get<1ul,int_const,std::__cxx11::string>
                          ((pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)key);
    mVar1 = *(mapped_type *)&(value->_M_dataplus)._M_p;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)&__range1,local_238);
    *pmVar3 = mVar1;
    std::
    _Rb_tree_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"twelve",
             (allocator<char> *)
             ((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage + 7));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)&__range1,&local_258);
  this_02 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*pmVar3);
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_end_of_storage + 7));
  local_294[0] = 1;
  local_294[1] = 2;
  local_294[2] = 3;
  local_288 = local_294;
  local_280 = 3;
  this_01 = (allocator<int> *)((long)a._M_elems + 0xb);
  std::allocator<int>::allocator(this_01);
  __l_00._M_len = local_280;
  __l_00._M_array = local_288;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_278,__l_00,this_01);
  std::allocator<int>::~allocator((allocator<int> *)((long)a._M_elems + 0xb));
  a._M_elems[1] = 5.60519e-45;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_278,(value_type_conflict2 *)(a._M_elems + 1)
            );
  vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x41a0000041200000;
  a._M_elems[0] = 30.0;
  local_2dc[0] = Male;
  local_2dc[1] = 0;
  local_2dc[2] = 0;
  local_2d0 = local_2dc;
  local_2c8 = 3;
  std::allocator<Gender>::allocator(&local_2dd);
  __l._M_len = local_2c8;
  __l._M_array = local_2d0;
  std::vector<Gender,_std::allocator<Gender>_>::vector
            ((vector<Gender,_std::allocator<Gender>_> *)local_2c0,__l,&local_2dd);
  std::allocator<Gender>::~allocator(&local_2dd);
  print_container<std::vector<int,_std::allocator<int>_>_>
            ((vector<int,_std::allocator<int>_> *)local_278);
  print_container<std::array<float,_3UL>_>
            ((array<float,_3UL> *)
             &vg.super__Vector_base<Gender,_std::allocator<Gender>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage);
  print_container<std::vector<Gender,_std::allocator<Gender>_>_>
            ((vector<Gender,_std::allocator<Gender>_> *)local_2c0);
  print_container((vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_70);
  std::vector<Gender,_std::allocator<Gender>_>::~vector
            ((vector<Gender,_std::allocator<Gender>_> *)local_2c0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_278);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__range1);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_138);
  std::
  vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_70);
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Pair
            ((Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_40);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{

    auto p = KeyValue{10, "ten"};
    auto vp = vector<KeyValue>{
        {10, "ten"},
        {11, "eleven"},
        {12, "twelve"}
    };

    auto m1 = map<int, string>{
        {10, "ten"},
        {11, "eleven"},
        {12, "twelve"}
    };

    auto m2 = map<string, int>();
//    {
//        {"ten", 10},
//        {"eleven", 11},
//        {"twelve", 12}
//    };

//    for(auto iter=m1.begin(); iter!=m1.end(); ++iter)
//    {
//        const auto& item = *iter; // item is of type pair<int, string>
//        const auto& key = item.first;
//        const auto& value = item.second;
//        m2[value] = key;
//    }

//    for(auto iter=m1.begin(); iter!=m1.end(); ++iter)
//    {
//        const auto& [key, value] = *iter; // structured-binding
//        m2[value] = key;
//    }

    for(const auto& [key, value] : m1)
        m2[value] = key;

    cout << m2["twelve"] << endl;

    auto v = vector<int>{1, 2, 3};
    v.push_back(4);
    auto a = array<float, 3>{10.0f, 20.0f, 30.0f};
    auto vg = vector<Gender>{Male, Female, Female};
    print_container(v);
    print_container(a);
    print_container(vg);
    print_container(vp);

//    print_container(10);

    return 0;
}